

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ROL_AC(CPU *this)

{
  byte bVar1;
  uint8_t cr;
  CPU *this_local;
  
  this->cycles = 2;
  bVar1 = (this->field_6).ps;
  (this->field_6).ps =
       (this->field_6).ps & 0xfe | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80));
  this->A = this->A << 1;
  this->A = this->A | (bVar1 & 1) != 0;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::ROL_AC()
{
    cycles = 2;
    uint8_t cr = C ? 0b00000001 : 0;
    C = (A & 0b10000000) > 0;
    A <<= 1;
    A |= cr;
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}